

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O2

void ssh1mainchan_start_command(SshChannel *sc,_Bool want_reply,char *command)

{
  long lVar1;
  
  lVar1 = (*(code *)((sc[0xd].cl)->logctx->queue).tail)(0xd);
  BinarySink_put_stringz((BinarySink *)(lVar1 + 0x60),command);
  pq_base_push((PacketQueueBase *)sc[0xe].cl,(PacketQueueNode *)(lVar1 + 0x40));
  ssh1mainchan_queue_response((ssh1_connection_state *)(sc + -2),want_reply,true);
  return;
}

Assistant:

static void ssh1mainchan_start_command(
    SshChannel *sc, bool want_reply, const char *command)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_CMSG_EXEC_CMD);
    put_stringz(pktout, command);
    pq_push(s->ppl.out_pq, pktout);

    ssh1mainchan_queue_response(s, want_reply, true);
}